

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

ImRect GetResizeBorderRect(ImGuiWindow *window,int border_n,float perp_padding,float thickness)

{
  float fVar1;
  float fVar2;
  undefined1 auVar3 [16];
  undefined1 in_register_00001204 [60];
  undefined1 auVar5 [56];
  undefined1 auVar4 [64];
  float fVar6;
  undefined1 auVar7 [16];
  undefined1 in_register_00001244 [60];
  undefined1 auVar9 [56];
  float fVar10;
  ImRect IVar11;
  undefined1 auVar8 [64];
  
  auVar9 = in_register_00001244._4_56_;
  auVar5 = in_register_00001204._4_56_;
  IVar11 = ImGuiWindow::Rect(window);
  auVar8._0_8_ = IVar11.Max;
  auVar8._8_56_ = auVar9;
  auVar7 = auVar8._0_16_;
  auVar4._0_8_ = IVar11.Min;
  auVar4._8_56_ = auVar5;
  if ((thickness == 0.0) && (!NAN(thickness))) {
    auVar7._0_4_ = IVar11.Max.x + -1.0;
    auVar7._4_4_ = IVar11.Max.y + -1.0;
    auVar7._8_4_ = auVar9._0_4_ + -1.0;
    auVar7._12_4_ = auVar9._4_4_ + -1.0;
  }
  auVar3 = auVar4._0_16_;
  fVar6 = auVar7._0_4_;
  switch(border_n) {
  case 0:
    auVar7 = vmovshdup_avx(auVar3);
    fVar10 = auVar7._0_4_;
    break;
  case 1:
    auVar3 = vmovshdup_avx(auVar3);
    fVar2 = auVar3._0_4_;
    goto LAB_001575b7;
  case 2:
    auVar7 = vmovshdup_avx(auVar7);
    fVar10 = auVar7._0_4_;
    break;
  case 3:
    auVar3 = vmovshdup_avx(auVar3);
    fVar2 = auVar3._0_4_;
    fVar6 = IVar11.Min.x;
LAB_001575b7:
    fVar2 = fVar2 + perp_padding;
    fVar1 = fVar6 - thickness;
    fVar6 = fVar6 + thickness;
    auVar7 = vmovshdup_avx(auVar7);
    fVar10 = auVar7._0_4_ - perp_padding;
    goto LAB_001575bf;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                  ,0x1490,"ImRect GetResizeBorderRect(ImGuiWindow *, int, float, float)");
  }
  fVar1 = IVar11.Min.x + perp_padding;
  fVar2 = fVar10 - thickness;
  fVar6 = fVar6 - perp_padding;
  fVar10 = fVar10 + thickness;
LAB_001575bf:
  auVar7 = vinsertps_avx(ZEXT416((uint)fVar6),ZEXT416((uint)fVar10),0x10);
  auVar3 = vinsertps_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar2),0x10);
  IVar11.Min = auVar3._0_8_;
  IVar11.Max = auVar7._0_8_;
  return IVar11;
}

Assistant:

static ImRect GetResizeBorderRect(ImGuiWindow* window, int border_n, float perp_padding, float thickness)
{
    ImRect rect = window->Rect();
    if (thickness == 0.0f) rect.Max -= ImVec2(1, 1);
    if (border_n == 0) { return ImRect(rect.Min.x + perp_padding, rect.Min.y - thickness,    rect.Max.x - perp_padding, rect.Min.y + thickness);    } // Top
    if (border_n == 1) { return ImRect(rect.Max.x - thickness,    rect.Min.y + perp_padding, rect.Max.x + thickness,    rect.Max.y - perp_padding); } // Right
    if (border_n == 2) { return ImRect(rect.Min.x + perp_padding, rect.Max.y - thickness,    rect.Max.x - perp_padding, rect.Max.y + thickness);    } // Bottom
    if (border_n == 3) { return ImRect(rect.Min.x - thickness,    rect.Min.y + perp_padding, rect.Min.x + thickness,    rect.Max.y - perp_padding); } // Left
    IM_ASSERT(0);
    return ImRect();
}